

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

void __thiscall
math::wide_integer::uintwide_t<1024U,_unsigned_int,_void,_false>::shl<unsigned_long>
          (uintwide_t<1024U,_unsigned_int,_void,_false> *this,unsigned_long n)

{
  uint uVar1;
  byte bVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  
  uVar3 = 0x20;
  if (n >> 5 < 0x20) {
    uVar3 = n >> 5;
  }
  bVar2 = (byte)n & 0x1f;
  if (0x1f < n) {
    for (lVar4 = 0; uVar3 * 4 + -0x80 != lVar4; lVar4 = lVar4 + -4) {
      *(undefined4 *)((long)(this->values).super_array<unsigned_int,_32UL>.elems + lVar4 + 0x7c) =
           *(undefined4 *)((long)this + lVar4 + uVar3 * -4 + 0x7c);
    }
    for (lVar4 = 0; uVar3 * 4 - lVar4 != 0; lVar4 = lVar4 + 4) {
      *(undefined4 *)((long)(this->values).super_array<unsigned_int,_32UL>.elems + lVar4) = 0;
    }
  }
  if ((n & 0x1f) != 0) {
    uVar5 = 0;
    for (lVar4 = uVar3 << 2; lVar4 != 0x80; lVar4 = lVar4 + 4) {
      uVar1 = *(uint *)((long)(this->values).super_array<unsigned_int,_32UL>.elems + lVar4);
      *(uint *)((long)(this->values).super_array<unsigned_int,_32UL>.elems + lVar4) =
           uVar1 << bVar2 | uVar5;
      uVar5 = uVar1 >> (0x20 - bVar2 & 0x1f);
    }
  }
  return;
}

Assistant:

constexpr auto shl(IntegralType n) -> void
    {
      const auto offset =
        (detail::min_unsafe)(static_cast<unsigned_fast_type>(static_cast<unsigned_fast_type>(n) / static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits)),
                             static_cast<unsigned_fast_type>(number_of_limbs));

      const auto left_shift_amount = static_cast<unsigned_fast_type>(static_cast<unsigned_fast_type>(n) % static_cast<unsigned_fast_type>(std::numeric_limits<limb_type>::digits));

      if(offset > static_cast<unsigned_fast_type>(UINT8_C(0)))
      {
        detail::copy_backward_unsafe(values.cbegin(),
                                     detail::advance_and_point(values.cbegin(), static_cast<size_t>(number_of_limbs - offset)),
                                     detail::advance_and_point(values.begin(), static_cast<size_t>(number_of_limbs)));

        detail::fill_unsafe(values.begin(), detail::advance_and_point(values.begin(), static_cast<size_t>(offset)), static_cast<limb_type>(UINT8_C(0)));
      }

      using local_integral_type = unsigned_fast_type;

      if(left_shift_amount != static_cast<local_integral_type>(UINT8_C(0)))
      {
        auto part_from_previous_value = static_cast<limb_type>(UINT8_C(0));

        auto ai = detail::advance_and_point(values.begin(), offset); // NOLINT(llvm-qualified-auto,readability-qualified-auto)

        while(ai != values.end()) // NOLINT(altera-id-dependent-backward-branch)
        {
          const auto t = *ai;

          *ai++ =
            static_cast<limb_type>
            (
                static_cast<limb_type>(t << static_cast<local_integral_type>(left_shift_amount))
              | part_from_previous_value
            );

          const auto right_shift_previous_value =
            static_cast<local_integral_type>
            (
              static_cast<unsigned_fast_type>
              (
                  static_cast<std::int_fast32_t>(std::numeric_limits<limb_type>::digits)
                - static_cast<std::int_fast32_t>(left_shift_amount)
              )
            );

          part_from_previous_value = static_cast<limb_type>(t >> right_shift_previous_value);
        }
      }
    }